

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O1

size_t btokBAuthCT_keep(size_t l)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = l * 2 + 7;
  sVar2 = bignStart_keep(l,btokBAuthCT_deep);
  return sVar2 + (uVar1 >> 4) + (uVar1 >> 3) + (l * 2 + 0x3f >> 2 & 0xfffffffffffffff0) + 0x200;
}

Assistant:

size_t btokBAuthCT_keep(size_t l)
{
	const size_t n = W_OF_B(2 * l);
	const size_t no = O_OF_B(2 * l);
	return sizeof(bake_bauth_ct_o) +
		bignStart_keep(l, btokBAuthCT_deep) +
		2 * O_OF_W(n) + no + no / 2;
}